

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Instr.cc
# Opt level: O2

void __thiscall flow::Instr::addOperand(Instr *this,Value *value)

{
  BasicBlock *successor;
  Value *local_18;
  
  local_18 = value;
  std::vector<flow::Value_*,_std::allocator<flow::Value_*>_>::push_back(&this->operands_,&local_18);
  Value::addUse(local_18,this);
  if (local_18 != (Value *)0x0) {
    successor = (BasicBlock *)__dynamic_cast(local_18,&Value::typeinfo,&BasicBlock::typeinfo,0);
    if (successor != (BasicBlock *)0x0) {
      BasicBlock::linkSuccessor(this->basicBlock_,successor);
    }
  }
  return;
}

Assistant:

void Instr::addOperand(Value* value) {
  operands_.push_back(value);

  value->addUse(this);

  if (BasicBlock* newBB = dynamic_cast<BasicBlock*>(value)) {
    getBasicBlock()->linkSuccessor(newBB);
  }
}